

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleDictionaryTypeHandler.cpp
# Opt level: O2

BOOL __thiscall
Js::SimpleDictionaryTypeHandlerBase<unsigned_short,_Js::JavascriptString_*,_false>::FreezeImpl
          (SimpleDictionaryTypeHandlerBase<unsigned_short,_Js::JavascriptString_*,_false> *this,
          DynamicObject *instance,bool isConvertedType)

{
  _func_int *UNRECOVERED_JUMPTABLE;
  int iVar1;
  DictionaryTypeHandlerBase<unsigned_short> *pDVar2;
  
  pDVar2 = ConvertToDictionaryType(this,instance);
  UNRECOVERED_JUMPTABLE = (pDVar2->super_DynamicTypeHandler)._vptr_DynamicTypeHandler[99];
  iVar1 = (*UNRECOVERED_JUMPTABLE)(pDVar2,instance,0,UNRECOVERED_JUMPTABLE);
  return iVar1;
}

Assistant:

BOOL SimpleDictionaryTypeHandlerBase<TPropertyIndex, TMapKey, IsNotExtensibleSupported>::FreezeImpl(DynamicObject* instance, bool isConvertedType)
    {
        if (IsNotExtensibleSupported)
        {
            if (this->GetFlags() & IsFrozenOnceFlag)
            {
                // Already frozen => no further change needed.
                return TRUE;
            }

            if (!GetIsLocked() && !instance->HasObjectArray())
            {
                // If there is object array, we need to convert both type handler and array to ES5.
                // Otherwise, if the type is not shared with others, we can just change it by itself.
                // If the type is not shared with others, we can just change it by itself.
                return FreezeInternal(instance, isConvertedType);
            }
        }

        return ConvertToDictionaryType(instance)->Freeze(instance);
    }